

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayingState.cpp
# Opt level: O2

void PlayingState::CmdUnWield
               (string *input,shared_ptr<Connection> *connection,shared_ptr<GameData> *game_data)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  ItemContainer *pIVar4;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_299;
  shared_ptr<Item> main;
  shared_ptr<Player> player;
  string local_278;
  shared_ptr<Item> local_258;
  undefined1 local_248 [24];
  __shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2> local_230;
  __shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2> local_220;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_210;
  string match;
  string local_1d8 [32];
  string local_1b8;
  stringstream ss;
  ostream local_188 [16];
  string local_178 [360];
  
  Connection::GetPlayer((Connection *)&player);
  std::__cxx11::string::string((string *)&ss,"main",(allocator *)&local_278);
  std::__cxx11::string::string(local_178,"off",(allocator *)&main);
  __l._M_len = 2;
  __l._M_array = (iterator)&ss;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_210,__l,&local_299);
  std::__cxx11::string::string((string *)&local_1b8,(string *)input);
  Utils::FindMatch(&match,&local_210,&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_210);
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(&ss + lVar3));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  bVar1 = std::operator==(&match,"main");
  if (bVar1) {
    Player::GetMainHand((Player *)&main);
    if (main.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
      poVar2 = std::operator<<(local_188,"Nothing to unwield");
      std::operator<<(poVar2,(string *)&Format::NL_abi_cxx11_);
    }
    else {
      local_248._0_8_ = 0;
      local_248._8_8_ = 0;
      Player::SetMainHand(player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          (shared_ptr<Item> *)local_248);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_248 + 8));
      pIVar4 = &(player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_ItemContainer;
      std::__shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_220,&main.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>);
      ItemContainer::AddItem(pIVar4,(shared_ptr<Item> *)&local_220);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_220._M_refcount);
      poVar2 = std::operator<<(local_188,"Unwielded ");
      Item::GetItemName_abi_cxx11_
                (&local_278,main.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      poVar2 = std::operator<<(poVar2,(string *)&local_278);
      std::operator<<(poVar2,(string *)&Format::NL_abi_cxx11_);
LAB_0015ecea:
      std::__cxx11::string::~string((string *)&local_278);
    }
  }
  else {
    bVar1 = std::operator==(&match,"off");
    if (!bVar1) {
      poVar2 = std::operator<<(local_188,"Please indicate <main> or <off> hand");
      std::operator<<(poVar2,(string *)&Format::NL_abi_cxx11_);
      goto LAB_0015ed6d;
    }
    Player::GetOffHand((Player *)&main);
    if (main.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      local_258.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      local_258.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      Player::SetOffHand(player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         &local_258);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_258.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      pIVar4 = &(player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_ItemContainer;
      std::__shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_230,&main.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>);
      ItemContainer::AddItem(pIVar4,(shared_ptr<Item> *)&local_230);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_230._M_refcount);
      poVar2 = std::operator<<(local_188,"Unwielded ");
      Item::GetItemName_abi_cxx11_
                (&local_278,main.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      poVar2 = std::operator<<(poVar2,(string *)&local_278);
      std::operator<<(poVar2,(string *)&Format::NL_abi_cxx11_);
      goto LAB_0015ecea;
    }
    poVar2 = std::operator<<(local_188,"Nothing to unwield");
    std::operator<<(poVar2,(string *)&Format::NL_abi_cxx11_);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&main.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_0015ed6d:
  std::__cxx11::stringbuf::str();
  (**((player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_Entity).
     _vptr_Entity)(player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_ptr,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::__cxx11::string::~string((string *)&match);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&player.super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void PlayingState::CmdUnWield(const std::string &input, std::shared_ptr<Connection> connection,
                              std::shared_ptr<GameData> game_data) {
    auto player = connection->GetPlayer();
    auto match = Utils::FindMatch({"main", "off"}, input);
    std::stringstream ss;
    if(match == "main") {
        auto main = player->GetMainHand();
        if (main != nullptr) {
            player->SetMainHand(nullptr);
            player->AddItem(main);
            ss << "Unwielded " << main->GetItemName() << Format::NL;
        } else {
            ss << "Nothing to unwield" << Format::NL;
        }
    }
    else if(match == "off") {
        auto off = player->GetOffHand();
        if(off != nullptr) {
            player->SetOffHand(nullptr);
            player->AddItem(off);
            ss << "Unwielded " << off->GetItemName() << Format::NL;
        } else {
            ss << "Nothing to unwield" << Format::NL;
        }
    }
    else {
        ss << "Please indicate <main> or <off> hand" << Format::NL;
    }
    player->Send(ss.str());
}